

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O1

bool __thiscall crnd::crn_unpacker::decode_alpha_selectors_etcs(crn_unpacker *this)

{
  byte *pbVar1;
  crn_header *pcVar2;
  unsigned_short *puVar3;
  bool bVar4;
  byte bVar5;
  sbyte sVar6;
  ushort uVar7;
  uint32 uVar8;
  uint uVar9;
  uint8 *puVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  uint p;
  ulong uVar14;
  uint uVar15;
  int iVar16;
  uint8 s_linear [8];
  static_huffman_data_model dm;
  byte local_68 [8];
  crn_unpacker *local_60;
  static_huffman_data_model local_58;
  
  pcVar2 = this->m_pHeader;
  uVar11 = (uint)(pcVar2->m_alpha_selectors).m_size.m_buf[2] |
           (uint)(pcVar2->m_alpha_selectors).m_size.m_buf[1] << 8 |
           (uint)(pcVar2->m_alpha_selectors).m_size.m_buf[0] << 0x10;
  if (uVar11 != 0) {
    puVar10 = this->m_pData +
              ((ulong)(pcVar2->m_alpha_selectors).m_ofs.m_buf[2] |
              (ulong)((uint)(pcVar2->m_alpha_selectors).m_ofs.m_buf[0] << 0x10 |
                     (uint)(pcVar2->m_alpha_selectors).m_ofs.m_buf[1] << 8));
    (this->m_codec).m_pDecode_buf = puVar10;
    (this->m_codec).m_pDecode_buf_next = puVar10;
    (this->m_codec).m_decode_buf_size = uVar11;
    (this->m_codec).m_pDecode_buf_end = puVar10 + uVar11;
    (this->m_codec).m_bit_buf = 0;
    (this->m_codec).m_bit_count = 0;
  }
  local_58.m_total_syms = 0;
  local_58.m_code_sizes.m_p = (uchar *)0x0;
  local_58.m_code_sizes.m_size = 0;
  local_58.m_code_sizes.m_capacity = 0;
  local_58.m_code_sizes.m_alloc_failed = false;
  local_58.m_pDecode_tables = (decoder_tables *)0x0;
  symbol_codec::decode_receive_static_data_model(&this->m_codec,&local_58);
  uVar7 = *(ushort *)(this->m_pHeader->m_alpha_selectors).m_num.m_buf;
  uVar7 = uVar7 << 8 | uVar7 >> 8;
  uVar15 = (uint)uVar7 + (uint)uVar7 * 2;
  uVar11 = (this->m_alpha_selectors).m_size;
  if (uVar11 != uVar15) {
    if (uVar11 <= uVar15) {
      if ((this->m_alpha_selectors).m_capacity < uVar15) {
        bVar4 = elemental_vector::increase_capacity
                          ((elemental_vector *)&this->m_alpha_selectors,uVar15,uVar11 + 1 == uVar15,
                           2,(object_mover)0x0);
        if (!bVar4) {
          (this->m_alpha_selectors).m_alloc_failed = true;
          goto LAB_00113aa5;
        }
      }
      uVar11 = (this->m_alpha_selectors).m_size;
      memset((this->m_alpha_selectors).m_p + uVar11,0,(ulong)(uVar15 - uVar11) * 2);
    }
    (this->m_alpha_selectors).m_size = uVar15;
  }
LAB_00113aa5:
  local_68[0] = 0;
  local_68[1] = 0;
  local_68[2] = 0;
  local_68[3] = 0;
  local_68[4] = 0;
  local_68[5] = 0;
  local_68[6] = 0;
  local_68[7] = 0;
  if (((this->m_alpha_selectors).m_size & 0x7fffffff) != 0) {
    puVar3 = (this->m_alpha_selectors).m_p;
    uVar11 = 0;
    local_60 = this;
    do {
      iVar16 = 3;
      uVar13 = 0;
      uVar14 = 0;
      do {
        if ((uVar14 & 1) == 0) {
          uVar8 = symbol_codec::decode(&this->m_codec,&local_58);
          bVar5 = (byte)uVar8 ^ local_68[uVar14 >> 1];
          local_68[uVar14 >> 1] = bVar5;
          uVar13 = (ulong)bVar5;
        }
        else {
          uVar13 = uVar13 >> 3;
        }
        uVar9 = ((uint)uVar14 & 3) * 9 + iVar16 + (int)(uVar14 >> 2) * -9;
        uVar12 = (uint)uVar13 & 7;
        uVar15 = 3 - uVar12;
        if (3 < uVar12) {
          uVar15 = uVar12;
        }
        uVar12 = uVar9 & 7;
        sVar6 = (sbyte)uVar12;
        uVar9 = (uVar9 >> 3 & 0x1f) + uVar11;
        pbVar1 = (byte *)((long)puVar3 + (ulong)uVar9);
        *pbVar1 = *pbVar1 | (byte)(uVar15 << (8U - sVar6 & 0x1f));
        if (uVar12 < 3) {
          pbVar1 = (byte *)((long)puVar3 + (ulong)(uVar9 - 1));
          *pbVar1 = *pbVar1 | (byte)(uVar15 >> sVar6);
        }
        uVar15 = (uint)uVar14 + 1;
        uVar14 = (ulong)uVar15;
        iVar16 = iVar16 + 3;
      } while (uVar15 != 0x10);
      uVar11 = uVar11 + 6;
    } while (uVar11 < (local_60->m_alpha_selectors).m_size * 2);
  }
  static_huffman_data_model::~static_huffman_data_model(&local_58);
  return true;
}

Assistant:

bool decode_alpha_selectors_etcs()
        {
            m_codec.start_decoding(m_pData + m_pHeader->m_alpha_selectors.m_ofs, m_pHeader->m_alpha_selectors.m_size);
            static_huffman_data_model dm;
            m_codec.decode_receive_static_data_model(dm);
            m_alpha_selectors.resize(m_pHeader->m_alpha_selectors.m_num * 3);
            uint8 s_linear[8] = {};
            uint8* data = (uint8*)m_alpha_selectors.begin();
            for (uint i = 0; i < (m_alpha_selectors.size() << 1); i += 6)
            {
                for (uint s_group = 0, p = 0; p < 16; p++)
                {
                    s_group = p & 1 ? s_group >> 3 : s_linear[p >> 1] ^= m_codec.decode(dm);
                    uint8 s = s_group & 7;
                    if (s <= 3)
                        s = 3 - s;
                    uint8 d = 3 * (p + 1) + 9 * ((p & 3) - (p >> 2));
                    uint8 byte_offset = d >> 3;
                    uint8 bit_offset = d & 7;
                    data[i + byte_offset] |= s << (8 - bit_offset);
                    if (bit_offset < 3)
                        data[i + byte_offset - 1] |= s >> bit_offset;
                }
            }
            m_codec.stop_decoding();
            return true;
        }